

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O3

bool QSslSocket::setActiveBackend(QString *backendName)

{
  int *piVar1;
  long lVar2;
  QMutex QVar3;
  QDebug QVar4;
  char cVar5;
  QLoggingCategory *pQVar6;
  char16_t *pcVar7;
  long in_FS_OFFSET;
  QStringView QVar8;
  QStringView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QStringView QVar14;
  QArrayDataPointer<QString> local_70;
  char *local_58;
  QDebug local_50;
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((backendName->d).size == 0) {
    pQVar6 = QtPrivateLogging::lcSsl();
    if (((pQVar6->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      setActiveBackend((QSslSocket *)pQVar6);
    }
    cVar5 = '\0';
  }
  else {
    if ((QBasicAtomicPointer<QMutexPrivate>)
        QSslSocketPrivate::backendMutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p ==
        (__base_type)0x0) {
      LOCK();
      QSslSocketPrivate::backendMutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p =
           (QBasicMutex)(QBasicAtomicPointer<QMutexPrivate>)0x1;
      UNLOCK();
    }
    else {
      QBasicMutex::lockInternal();
    }
    if (QSslSocketPrivate::tlsBackend == (QTlsBackend *)0x0) {
      QTlsBackend::availableBackendNames();
      QVar14.m_data = (backendName->d).ptr;
      QVar14.m_size = (backendName->d).size;
      cVar5 = QtPrivate::QStringList_contains((QList *)&local_70,QVar14,CaseSensitive);
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_70);
      if (cVar5 == '\0') {
        pQVar6 = QtPrivateLogging::lcSsl();
        if (((pQVar6->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
          local_58 = pQVar6->name;
          local_70.d._0_4_ = 2;
          local_70.d._4_4_ = 0;
          local_70.ptr._0_4_ = 0;
          local_70.ptr._4_4_ = 0;
          local_70.size._0_4_ = 0;
          local_70.size._4_4_ = 0;
          QMessageLogger::warning();
          QVar4.stream = local_50.stream;
          QVar12.m_data = (storage_type *)0x24;
          QVar12.m_size = (qsizetype)local_48;
          QString::fromUtf8(QVar12);
          QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_48);
          if (local_48[0] != (QArrayData *)0x0) {
            LOCK();
            (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_48[0],2,0x10);
            }
          }
          if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_50.stream,' ');
          }
          pcVar7 = (backendName->d).ptr;
          if (pcVar7 == (char16_t *)0x0) {
            pcVar7 = (char16_t *)&QString::_empty;
          }
          QDebug::putString((QChar *)&local_50,(ulong)pcVar7);
          if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_50.stream,' ');
          }
          QVar4.stream = local_50.stream;
          QVar13.m_data = (storage_type *)0x9;
          QVar13.m_size = (qsizetype)local_48;
          QString::fromUtf8(QVar13);
          QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_48);
          if (local_48[0] != (QArrayData *)0x0) {
            LOCK();
            (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                 (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(local_48[0],2,0x10);
            }
          }
          if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
            QTextStream::operator<<((QTextStream *)local_50.stream,' ');
          }
          QDebug::~QDebug(&local_50);
        }
      }
      else {
        QString::operator=(&QSslSocketPrivate::activeBackendName,(QString *)backendName);
      }
      QVar3.super_QBasicMutex.d_ptr._q_value._M_b._M_p =
           QSslSocketPrivate::backendMutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p;
      LOCK();
      QSslSocketPrivate::backendMutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p =
           (QBasicMutex)(QBasicAtomicPointer<QMutexPrivate>)0x0;
      UNLOCK();
      if ((QBasicAtomicPointer<QMutexPrivate>)QVar3.super_QBasicMutex.d_ptr._q_value._M_b._M_p !=
          (__base_type)0x1) {
        QBasicMutex::unlockInternalFutex(&QSslSocketPrivate::backendMutex);
      }
    }
    else {
      pQVar6 = QtPrivateLogging::lcSsl();
      if (((pQVar6->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
        local_58 = pQVar6->name;
        local_70.d._0_4_ = 2;
        local_70.d._4_4_ = 0;
        local_70.ptr._0_4_ = 0;
        local_70.ptr._4_4_ = 0;
        local_70.size._0_4_ = 0;
        local_70.size._4_4_ = 0;
        QMessageLogger::warning();
        QVar4.stream = local_50.stream;
        QVar10.m_data = &DAT_00000018;
        QVar10.m_size = (qsizetype)local_48;
        QString::fromUtf8(QVar10);
        QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_48);
        if (local_48[0] != (QArrayData *)0x0) {
          LOCK();
          (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_48[0],2,0x10);
          }
        }
        if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_50.stream,' ');
        }
        pcVar7 = (backendName->d).ptr;
        if (pcVar7 == (char16_t *)0x0) {
          pcVar7 = (char16_t *)&QString::_empty;
        }
        QDebug::putString((QChar *)&local_50,(ulong)pcVar7);
        if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_50.stream,' ');
        }
        QVar4.stream = local_50.stream;
        QVar11.m_data = (storage_type *)0x2c;
        QVar11.m_size = (qsizetype)local_48;
        QString::fromUtf8(QVar11);
        QTextStream::operator<<((QTextStream *)QVar4.stream,(QString *)local_48);
        if (local_48[0] != (QArrayData *)0x0) {
          LOCK();
          (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_48[0],2,0x10);
          }
        }
        if (*(QTextStream *)(local_50.stream + 0x30) == (QTextStream)0x1) {
          QTextStream::operator<<((QTextStream *)local_50.stream,' ');
        }
        QDebug::~QDebug(&local_50);
      }
      QVar3.super_QBasicMutex.d_ptr._q_value._M_b._M_p =
           QSslSocketPrivate::backendMutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p;
      LOCK();
      QSslSocketPrivate::backendMutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p =
           (QBasicMutex)(QBasicAtomicPointer<QMutexPrivate>)0x0;
      UNLOCK();
      if ((QBasicAtomicPointer<QMutexPrivate>)QVar3.super_QBasicMutex.d_ptr._q_value._M_b._M_p !=
          (__base_type)0x1) {
        QBasicMutex::unlockInternalFutex(&QSslSocketPrivate::backendMutex);
      }
      activeBackend();
      lVar2 = CONCAT44(local_70.size._4_4_,(undefined4)local_70.size);
      if (lVar2 == (backendName->d).size) {
        QVar9.m_data._4_4_ = local_70.ptr._4_4_;
        QVar9.m_data._0_4_ = local_70.ptr._0_4_;
        QVar8.m_data = (backendName->d).ptr;
        QVar8.m_size = lVar2;
        QVar9.m_size = lVar2;
        cVar5 = QtPrivate::equalStrings(QVar9,QVar8);
      }
      else {
        cVar5 = '\0';
      }
      piVar1 = (int *)CONCAT44(local_70.d._4_4_,local_70.d._0_4_);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_70.d._4_4_,local_70.d._0_4_),2,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (bool)cVar5;
}

Assistant:

bool QSslSocket::setActiveBackend(const QString &backendName)
{
    if (!backendName.size()) {
        qCWarning(lcSsl, "Invalid parameter (backend name cannot be an empty string)");
        return false;
    }

    QMutexLocker locker(&QSslSocketPrivate::backendMutex);
    if (QSslSocketPrivate::tlsBackend) {
        qCWarning(lcSsl) << "Cannot set backend named" << backendName
                         << "as active, another backend is already in use";
        locker.unlock();
        return activeBackend() == backendName;
    }

    if (!QTlsBackend::availableBackendNames().contains(backendName)) {
        qCWarning(lcSsl) << "Cannot set unavailable backend named" << backendName
                         << "as active";
        return false;
    }

    QSslSocketPrivate::activeBackendName = backendName;

    return true;
}